

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_remove_compressor(AV1_COMP *cpi)

{
  AV1_COMMON *cm;
  ThreadData_conflict *td;
  uint8_t **ppuVar1;
  aom_internal_error_info *paVar2;
  pthread_mutex_t *__mutex;
  pthread_cond_t *__cond;
  pthread_mutex_t *__mutex_00;
  pthread_mutex_t *__mutex_01;
  pthread_mutex_t *__mutex_02;
  uint num_planes;
  IntraBCHashInfo *pIVar3;
  int j;
  long lVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  if (cpi != (AV1_COMP *)0x0) {
    paVar2 = (cpi->common).error;
    if (paVar2 != (aom_internal_error_info *)0x0) {
      memset(paVar2->detail,0x41,199);
      ((cpi->common).error)->detail[199] = '\0';
      aom_free((cpi->common).error);
    }
    aom_free((cpi->td).tctx);
    __mutex = (cpi->mt_info).enc_row_mt.mutex_;
    __cond = (pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_;
    __mutex_00 = (cpi->mt_info).gm_sync.mutex_;
    __mutex_01 = (cpi->mt_info).tpl_row_mt.mutex_;
    __mutex_02 = (cpi->mt_info).pack_bs_sync.mutex_;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      aom_free(__mutex);
    }
    if (__cond != (pthread_cond_t *)0x0) {
      pthread_cond_destroy(__cond);
      aom_free(__cond);
    }
    if (__mutex_00 != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)__mutex_00);
      aom_free(__mutex_00);
    }
    if (__mutex_01 != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)__mutex_01);
      aom_free(__mutex_01);
    }
    if (__mutex_02 != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)__mutex_02);
      aom_free(__mutex_02);
    }
    av1_row_mt_mem_dealloc(cpi);
    if (1 < (cpi->mt_info).num_workers) {
      av1_row_mt_sync_mem_dealloc(&cpi->ppi->intra_row_mt_sync);
      av1_loop_filter_dealloc(&(cpi->mt_info).lf_row_sync);
      av1_cdef_mt_dealloc(&(cpi->mt_info).cdef_sync);
      av1_loop_restoration_dealloc(&(cpi->mt_info).lr_row_sync);
      av1_tf_mt_dealloc(&(cpi->mt_info).tf_sync);
    }
    cm = &cpi->common;
    num_planes = (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
    aom_free((cpi->mbmi_ext_info).frame_base);
    (cpi->mbmi_ext_info).frame_base = (MB_MODE_INFO_EXT_FRAME *)0x0;
    (cpi->mbmi_ext_info).alloc_size = 0;
    aom_free(cpi->tile_data);
    cpi->tile_data = (TileDataEnc *)0x0;
    cpi->allocated_tiles = 0;
    (cpi->mt_info).enc_row_mt.allocated_tile_rows = 0;
    (cpi->mt_info).enc_row_mt.allocated_tile_cols = 0;
    aom_free((cpi->enc_seg).map);
    (cpi->enc_seg).map = (uint8_t *)0x0;
    av1_cyclic_refresh_free(cpi->cyclic_refresh);
    cpi->cyclic_refresh = (CYCLIC_REFRESH *)0x0;
    aom_free((cpi->active_map).map);
    (cpi->active_map).map = (uchar *)0x0;
    aom_free(cpi->ssim_rdmult_scaling_factors);
    cpi->ssim_rdmult_scaling_factors = (double *)0x0;
    aom_free(cpi->tpl_rdmult_scaling_factors);
    cpi->tpl_rdmult_scaling_factors = (double *)0x0;
    aom_free((cpi->td).mb.obmc_buffer.mask);
    aom_free((cpi->td).mb.obmc_buffer.above_pred);
    aom_free((cpi->td).mb.obmc_buffer.left_pred);
    aom_free((cpi->td).mb.obmc_buffer.wsrc);
    (cpi->td).mb.obmc_buffer.above_pred = (uint8_t *)0x0;
    (cpi->td).mb.obmc_buffer.left_pred = (uint8_t *)0x0;
    (cpi->td).mb.obmc_buffer.wsrc = (int32_t *)0x0;
    (cpi->td).mb.obmc_buffer.mask = (int32_t *)0x0;
    aom_free((cpi->td).mv_costs_alloc);
    (cpi->td).mv_costs_alloc = (MvCosts *)0x0;
    aom_free((cpi->td).dv_costs_alloc);
    (cpi->td).dv_costs_alloc = (IntraBCMVCosts *)0x0;
    aom_free((cpi->td).mb.sb_stats_cache);
    (cpi->td).mb.sb_stats_cache = (SB_FIRST_PASS_STATS *)0x0;
    aom_free((cpi->td).mb.sb_fp_stats);
    (cpi->td).mb.sb_fp_stats = (SB_FIRST_PASS_STATS *)0x0;
    av1_free_pc_tree_recursive
              ((cpi->td).pc_root,num_planes,0,0,(cpi->sf).part_sf.partition_search_type);
    (cpi->td).pc_root = (PC_TREE *)0x0;
    pIVar3 = &(cpi->td).mb.intrabc_hash_info;
    lVar6 = 0;
    do {
      lVar4 = 0;
      do {
        aom_free(pIVar3->hash_value_buffer[0][lVar4]);
        pIVar3->hash_value_buffer[0][lVar4] = (uint32_t *)0x0;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      pIVar3 = (IntraBCHashInfo *)(pIVar3->hash_value_buffer + 1);
      bVar7 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar7);
    td = &cpi->td;
    av1_hash_table_destroy(&(cpi->td).mb.intrabc_hash_info.intrabc_hash_table);
    aom_free((cpi->common).tpl_mvs);
    (cpi->common).tpl_mvs = (TPL_MV_REF *)0x0;
    aom_free((cpi->td).pixel_gradient_info);
    (cpi->td).pixel_gradient_info = (PixelLevelGradientInfo *)0x0;
    aom_free((cpi->td).src_var_info_of_4x4_sub_blocks);
    (cpi->td).src_var_info_of_4x4_sub_blocks = (Block4x4VarInfo *)0x0;
    aom_free((cpi->td).vt64x64);
    (cpi->td).vt64x64 = (VP64x64 *)0x0;
    av1_free_pmc((cpi->td).firstpass_ctx,num_planes);
    (cpi->td).firstpass_ctx = (PICK_MODE_CONTEXT *)0x0;
    if ((cpi->tf_ctx).is_highbitdepth != 0) {
      ppuVar1 = &(cpi->td).tf_data.pred;
      *ppuVar1 = (uint8_t *)((long)*ppuVar1 << 1);
    }
    aom_free((cpi->td).tf_data.tmp_mbmi);
    (cpi->td).tf_data.tmp_mbmi = (MB_MODE_INFO *)0x0;
    aom_free((cpi->td).tf_data.accum);
    (cpi->td).tf_data.accum = (uint32_t *)0x0;
    aom_free((cpi->td).tf_data.count);
    (cpi->td).tf_data.count = (uint16_t *)0x0;
    aom_free((cpi->td).tf_data.pred);
    (cpi->td).tf_data.pred = (uint8_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.predictor8);
    (cpi->td).tpl_tmp_buffers.predictor8 = (uint8_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.src_diff);
    (cpi->td).tpl_tmp_buffers.src_diff = (int16_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.coeff);
    (cpi->td).tpl_tmp_buffers.coeff = (tran_low_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.qcoeff);
    (cpi->td).tpl_tmp_buffers.qcoeff = (tran_low_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.dqcoeff);
    (cpi->td).tpl_tmp_buffers.dqcoeff = (tran_low_t *)0x0;
    aom_free((cpi->td).gm_data.segment_map);
    (cpi->td).gm_data.segment_map = (uint8_t *)0x0;
    aom_free((cpi->td).gm_data.motion_models[0].inliers);
    (cpi->td).gm_data.motion_models[0].inliers = (int *)0x0;
    av1_cdef_dealloc_data(cpi->cdef_search_ctx);
    aom_free(cpi->cdef_search_ctx);
    cpi->cdef_search_ctx = (CdefSearchCtx *)0x0;
    aom_free((cpi->td).mb.txfm_search_info.mb_rd_record);
    (cpi->td).mb.txfm_search_info.mb_rd_record = (MB_RD_RECORD *)0x0;
    aom_free((cpi->td).mb.inter_modes_info);
    (cpi->td).mb.inter_modes_info = (inter_modes_info *)0x0;
    av1_dealloc_src_diff_buf(&td->mb,num_planes);
    aom_free((cpi->td).mb.e_mbd.seg_mask);
    (cpi->td).mb.e_mbd.seg_mask = (uint8_t *)0x0;
    aom_free((cpi->td).mb.winner_mode_stats);
    (cpi->td).mb.winner_mode_stats = (WinnerModeStats *)0x0;
    aom_free((cpi->td).mb.dqcoeff_buf);
    (cpi->td).mb.dqcoeff_buf = (tran_low_t *)0x0;
    av1_dealloc_mb_wiener_var_pred_buf(td);
    av1_free_txb_buf(cpi);
    av1_free_context_buffers(cm);
    aom_free_frame_buffer(&cpi->last_frame_uf);
    av1_free_restoration_buffers(cm);
    av1_free_firstpass_data(&cpi->firstpass_data);
    if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
      av1_free_cdef_buffers(cm,&(cpi->ppi->p_mt_info).cdef_worker,&(cpi->mt_info).cdef_sync);
    }
    uVar5 = 0;
    do {
      aom_free((cpi->pick_lr_ctxt).rusi[uVar5]);
      (cpi->pick_lr_ctxt).rusi[uVar5] = (RestUnitSearchInfo *)0x0;
      uVar5 = uVar5 + 1;
    } while (num_planes != uVar5);
    aom_free((cpi->pick_lr_ctxt).dgd_avg);
    (cpi->pick_lr_ctxt).dgd_avg = (int16_t *)0x0;
    aom_free_frame_buffer(&cpi->trial_frame_rst);
    aom_free_frame_buffer(&cpi->scaled_source);
    aom_free_frame_buffer(&cpi->scaled_last_source);
    aom_free_frame_buffer(&cpi->orig_source);
    aom_free_frame_buffer(&(cpi->svc).source_last_TL0);
    aom_free((cpi->token_info).tile_tok[0][0]);
    (cpi->token_info).tile_tok[0][0] = (TokenExtra *)0x0;
    aom_free((cpi->token_info).tplist[0][0]);
    (cpi->token_info).tplist[0][0] = (TokenList *)0x0;
    (cpi->token_info).tokens_allocated = 0;
    av1_free_shared_coeff_buffer(&(cpi->td).shared_coeff_buf);
    av1_free_sms_tree(td);
    aom_free((cpi->td).mb.palette_buffer);
    aom_free((cpi->td).mb.comp_rd_buffer.pred0);
    aom_free((cpi->td).mb.comp_rd_buffer.pred1);
    aom_free((cpi->td).mb.comp_rd_buffer.residual1);
    aom_free((cpi->td).mb.comp_rd_buffer.diff10);
    aom_free((cpi->td).mb.comp_rd_buffer.tmp_best_mask_buf);
    (cpi->td).mb.comp_rd_buffer.tmp_best_mask_buf = (uint8_t *)0x0;
    (cpi->td).mb.comp_rd_buffer.residual1 = (int16_t *)0x0;
    (cpi->td).mb.comp_rd_buffer.diff10 = (int16_t *)0x0;
    (cpi->td).mb.comp_rd_buffer.pred0 = (uint8_t *)0x0;
    (cpi->td).mb.comp_rd_buffer.pred1 = (uint8_t *)0x0;
    aom_free((cpi->td).mb.tmp_conv_dst);
    lVar6 = 0x3245;
    do {
      aom_free(*(void **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar6 * 8));
      lVar6 = lVar6 + 1;
    } while (lVar6 == 0x3246);
    if (cpi->denoise_and_model != (aom_denoise_and_model_t *)0x0) {
      aom_denoise_and_model_free(cpi->denoise_and_model);
      cpi->denoise_and_model = (aom_denoise_and_model_t *)0x0;
    }
    if (cpi->film_grain_table != (aom_film_grain_table_t *)0x0) {
      aom_film_grain_table_free(cpi->film_grain_table);
      aom_free(cpi->film_grain_table);
      cpi->film_grain_table = (aom_film_grain_table_t *)0x0;
    }
    if (cpi->ppi->use_svc != 0) {
      av1_free_svc_cyclic_refresh(cpi);
    }
    aom_free((cpi->svc).layer_context);
    (cpi->svc).layer_context = (LAYER_CONTEXT *)0x0;
    aom_free(cpi->consec_zero_mv);
    cpi->consec_zero_mv = (uint8_t *)0x0;
    cpi->consec_zero_mv_alloc_size = 0;
    aom_free(cpi->src_sad_blk_64x64);
    cpi->src_sad_blk_64x64 = (uint64_t *)0x0;
    aom_free(cpi->mb_weber_stats);
    cpi->mb_weber_stats = (WeberStats *)0x0;
    if ((cpi->oxcf).enable_rate_guide_deltaq != 0) {
      aom_free(cpi->prep_rate_estimates);
      cpi->prep_rate_estimates = (int *)0x0;
      aom_free(cpi->ext_rate_distribution);
      cpi->ext_rate_distribution = (double *)0x0;
    }
    aom_free(cpi->mb_delta_q);
    cpi->mb_delta_q = (int *)0x0;
    av1_ext_part_delete(&cpi->ext_part_controller);
    av1_remove_common(cm);
    aom_free(cpi);
    return;
  }
  return;
}

Assistant:

void av1_remove_compressor(AV1_COMP *cpi) {
  if (!cpi) return;
#if CONFIG_RATECTRL_LOG
  if (cpi->oxcf.pass == 3) {
    rc_log_show(&cpi->rc_log);
  }
#endif  // CONFIG_RATECTRL_LOG

  AV1_COMMON *cm = &cpi->common;
  if (cm->current_frame.frame_number > 0) {
#if CONFIG_SPEED_STATS
    if (!is_stat_generation_stage(cpi)) {
      fprintf(stdout, "tx_search_count = %d\n", cpi->tx_search_count);
    }
#endif  // CONFIG_SPEED_STATS

#if CONFIG_COLLECT_PARTITION_STATS == 2
    if (!is_stat_generation_stage(cpi)) {
      av1_print_fr_partition_timing_stats(&cpi->partition_stats,
                                          "fr_part_timing_data.csv");
    }
#endif
  }

#if CONFIG_AV1_TEMPORAL_DENOISING
  av1_denoiser_free(&(cpi->denoiser));
#endif

  if (cm->error) {
    // Help detect use after free of the error detail string.
    memset(cm->error->detail, 'A', sizeof(cm->error->detail) - 1);
    cm->error->detail[sizeof(cm->error->detail) - 1] = '\0';
    aom_free(cm->error);
  }
  aom_free(cpi->td.tctx);
  MultiThreadInfo *const mt_info = &cpi->mt_info;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *const enc_row_mt_mutex_ = mt_info->enc_row_mt.mutex_;
  pthread_cond_t *const enc_row_mt_cond_ = mt_info->enc_row_mt.cond_;
  pthread_mutex_t *const gm_mt_mutex_ = mt_info->gm_sync.mutex_;
  pthread_mutex_t *const tpl_error_mutex_ = mt_info->tpl_row_mt.mutex_;
  pthread_mutex_t *const pack_bs_mt_mutex_ = mt_info->pack_bs_sync.mutex_;
  if (enc_row_mt_mutex_ != NULL) {
    pthread_mutex_destroy(enc_row_mt_mutex_);
    aom_free(enc_row_mt_mutex_);
  }
  if (enc_row_mt_cond_ != NULL) {
    pthread_cond_destroy(enc_row_mt_cond_);
    aom_free(enc_row_mt_cond_);
  }
  if (gm_mt_mutex_ != NULL) {
    pthread_mutex_destroy(gm_mt_mutex_);
    aom_free(gm_mt_mutex_);
  }
  if (tpl_error_mutex_ != NULL) {
    pthread_mutex_destroy(tpl_error_mutex_);
    aom_free(tpl_error_mutex_);
  }
  if (pack_bs_mt_mutex_ != NULL) {
    pthread_mutex_destroy(pack_bs_mt_mutex_);
    aom_free(pack_bs_mt_mutex_);
  }
#endif
  av1_row_mt_mem_dealloc(cpi);

  if (mt_info->num_workers > 1) {
    av1_row_mt_sync_mem_dealloc(&cpi->ppi->intra_row_mt_sync);
    av1_loop_filter_dealloc(&mt_info->lf_row_sync);
    av1_cdef_mt_dealloc(&mt_info->cdef_sync);
#if !CONFIG_REALTIME_ONLY
    av1_loop_restoration_dealloc(&mt_info->lr_row_sync);
    av1_tf_mt_dealloc(&mt_info->tf_sync);
#endif
  }

#if CONFIG_THREE_PASS
  av1_free_thirdpass_ctx(cpi->third_pass_ctx);

  av1_close_second_pass_log(cpi);
#endif

  dealloc_compressor_data(cpi);

  av1_ext_part_delete(&cpi->ext_part_controller);

  av1_remove_common(cm);

  aom_free(cpi);

#ifdef OUTPUT_YUV_REC
  fclose(yuv_rec_file);
#endif

#ifdef OUTPUT_YUV_DENOISED
  fclose(yuv_denoised_file);
#endif
}